

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O1

void __thiscall libtorrent::aux::part_file::flush_metadata_impl(part_file *this,error_code *ec)

{
  uint uVar1;
  uint val;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  int iVar4;
  int iVar5;
  error_code *in_R9;
  undefined1 *__s;
  span<const_char> buf;
  string_view lhs;
  string_view rhs;
  file_handle f;
  vector<char,_std::allocator<char>_> header;
  key_type local_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [32];
  
  if (this->m_dirty_metadata == false) {
    return;
  }
  if ((this->m_piece_map)._M_h._M_element_count == 0) {
    lhs._M_str = (char *)(this->m_name)._M_string_length;
    lhs._M_len = (size_t)(this->m_path)._M_dataplus._M_p;
    rhs._M_str = (char *)in_R9;
    rhs._M_len = (size_t)(this->m_name)._M_dataplus._M_p;
    combine_path_abi_cxx11_
              ((string *)(local_58 + 0x10),(libtorrent *)(this->m_path)._M_string_length,lhs,rhs);
    remove((libtorrent *)(local_58 + 0x10),(char *)ec);
    local_58._0_8_ = (pointer)0x100000002;
    local_58._8_8_ = &boost::system::detail::cat_holder<void>::generic_category_instance;
    iVar4 = (*ec->cat_->_vptr_error_category[2])(ec->cat_,(ulong)(uint)ec->val_);
    if (((char)iVar4 != '\0') ||
       (iVar4 = (*((error_category *)local_58._8_8_)->_vptr_error_category[3])
                          (local_58._8_8_,ec,local_58._0_8_ & 0xffffffff), (char)iVar4 != '\0')) {
      ec->val_ = 0;
      ec->failed_ = false;
      ec->cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.
                  super_error_category;
    }
    if ((undefined1 *)local_48._0_8_ != local_58 + 0x20) {
      operator_delete((void *)local_48._0_8_,(ulong)(local_48._16_8_ + 1));
    }
    return;
  }
  open_file((part_file *)local_58,(open_mode_t)(uint)this,(error_code *)0x21);
  if (ec->failed_ == false) {
    ::std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)(local_58 + 0x10),(long)this->m_header_size,
               (allocator_type *)&local_5c);
    uVar1 = this->m_max_pieces;
    iVar4 = 0x18;
    __s = (undefined1 *)local_48._0_8_;
    do {
      *__s = (char)(uVar1 >> ((byte)iVar4 & 0x1f));
      __s = __s + 1;
      iVar4 = iVar4 + -8;
    } while (iVar4 != -8);
    uVar1 = this->m_piece_size;
    iVar4 = 0x18;
    do {
      *__s = (char)(uVar1 >> ((byte)iVar4 & 0x1f));
      __s = __s + 1;
      iVar4 = iVar4 + -8;
    } while (iVar4 != -8);
    local_5c.m_val = 0;
    if (0 < this->m_max_pieces) {
      do {
        p_Var2 = ::std::
                 _Hashtable<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>,_std::__detail::_Select1st,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_before_node
                           (&(this->m_piece_map)._M_h,
                            (ulong)(long)local_5c.m_val % (this->m_piece_map)._M_h._M_bucket_count,
                            &local_5c,(long)local_5c.m_val);
        if (p_Var2 == (__node_base_ptr)0x0) {
          p_Var3 = (_Hash_node_base *)0x0;
        }
        else {
          p_Var3 = p_Var2->_M_nxt;
        }
        if (p_Var3 == (_Hash_node_base *)0x0) {
          iVar4 = -1;
        }
        else {
          iVar4 = *(int *)((long)&p_Var3[1]._M_nxt + 4);
        }
        iVar5 = 0x18;
        do {
          *__s = (char)(iVar4 >> ((byte)iVar5 & 0x1f));
          __s = __s + 1;
          iVar5 = iVar5 + -8;
        } while (iVar5 != -8);
        local_5c.m_val = local_5c.m_val + 1;
      } while (local_5c.m_val < this->m_max_pieces);
    }
    memset(__s,0,(size_t)(((long)this->m_header_size - (long)__s) + local_48._0_8_));
    buf.m_ptr = local_48._8_8_ - local_48._0_8_;
    buf.m_len = 0;
    pwrite_all((aux *)(local_58._0_8_ & 0xffffffff),(handle_type)local_48._0_8_,buf,(int64_t)ec,
               in_R9);
    if (ec->failed_ == false) {
      this->m_dirty_metadata = false;
    }
    if ((undefined1 *)local_48._0_8_ != (undefined1 *)0x0) {
      operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
    }
  }
  file_handle::~file_handle((file_handle *)local_58);
  return;
}

Assistant:

void part_file::flush_metadata_impl(error_code& ec)
	{
		// do we need to flush the metadata?
		if (m_dirty_metadata == false) return;

		if (m_piece_map.empty())
		{
			// if we don't have any pieces left in the
			// part file, remove it
			std::string const p = combine_path(m_path, m_name);
			remove(p, ec);

			if (ec == boost::system::errc::no_such_file_or_directory)
				ec.clear();
			return;
		}

		auto f = open_file(aux::open_mode::write | aux::open_mode::hidden, ec);
		if (ec) return;

		std::vector<char> header(static_cast<std::size_t>(m_header_size));

		using namespace libtorrent::aux;

		char* ptr = header.data();
		write_uint32(m_max_pieces, ptr);
		write_uint32(m_piece_size, ptr);

		for (piece_index_t piece(0); piece < piece_index_t(m_max_pieces); ++piece)
		{
			auto const i = m_piece_map.find(piece);
			slot_index_t const slot(i == m_piece_map.end()
				? slot_index_t(-1) : i->second);
			write_int32(static_cast<int>(slot), ptr);
		}
		std::memset(ptr, 0, std::size_t(m_header_size - (ptr - header.data())));
		aux::pwrite_all(f.fd(), header, 0, ec);
		if (ec) return;
		m_dirty_metadata = false;
	}